

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::handleLabelSST(Record *record,size_t sheetIdx,IStorage *storage)

{
  RecordSubstream *this;
  int16_t xfIndex;
  int16_t column;
  int16_t row;
  size_t local_40;
  int32_t sstIndex;
  
  row = 0;
  column = 0;
  xfIndex = 0;
  sstIndex = 0;
  this = &record->m_stream;
  local_40 = sheetIdx;
  Stream::read<short>(&this->super_Stream,&row,2);
  Stream::read<short>(&this->super_Stream,&column,2);
  Stream::read<short>(&this->super_Stream,&xfIndex,2);
  Stream::read<int>(&this->super_Stream,&sstIndex,4);
  (*storage->_vptr_IStorage[5])(storage,local_40,(long)row,(long)column,(long)sstIndex);
  return;
}

Assistant:

inline void
Parser::handleLabelSST( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;
	int16_t xfIndex = 0;
	int32_t sstIndex = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );
	record.dataStream().read( xfIndex, 2 );
	record.dataStream().read( sstIndex, 4 );

	storage.onCellSharedString( sheetIdx, row, column, sstIndex );
}